

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O2

void __thiscall despot::Navigation::PrintState(Navigation *this,State *s,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int y;
  int iVar4;
  char *pcVar5;
  int x;
  int iVar6;
  char buffer [20];
  char acStack_48 [24];
  
  poVar2 = std::operator<<(out,"Flag = ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*(int *)(s + 0xc) % flag_size_);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (iVar4 = 0; iVar4 < this->ysize_; iVar4 = iVar4 + 1) {
    for (iVar6 = 0; iVar6 < this->xsize_; iVar6 = iVar6 + 1) {
      iVar3 = *(int *)(s + 0xc) >> (flag_bits_ & 0x1f);
      iVar1 = this->xsize_ * iVar4 + iVar6;
      if (iVar1 == this->goal_pos_) {
        pcVar5 = "G     ";
        if (iVar1 == iVar3) {
          pcVar5 = "T     ";
        }
      }
      else {
        pcVar5 = "R     ";
        if (iVar1 != iVar3) {
          sprintf(acStack_48,"%4.3f ",
                  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1]);
          pcVar5 = acStack_48;
        }
      }
      std::operator<<(out,pcVar5);
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void Navigation::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	out << "Flag = " << (s.state_id % flag_size_) << endl;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			if (pos == goal_pos_) {
				if ((s.state_id >> flag_bits_) == pos)
					out << "T     ";
				else
					out << "G     ";
			} else {
				if ((s.state_id >> flag_bits_) == pos)
					out << "R     ";
				else {
					sprintf(buffer, "%4.3f ", trap_prob_[pos]);
					out << buffer;
				}
			}
		}
		out << endl;
	}
}